

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ShaderSubroutine::NegativeTest7::test
          (NegativeTest7 *this,GLchar *vertex_shader_code,GLchar *name_of_recursive_routine)

{
  GLchar *__s;
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  MessageBuilder local_440 [2];
  exception *exc;
  undefined1 local_130 [4];
  GLuint index;
  program program;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  byte local_29;
  Functions *pFStack_28;
  bool result;
  Functions *gl;
  GLchar *name_of_recursive_routine_local;
  GLchar *vertex_shader_code_local;
  NegativeTest7 *this_local;
  
  gl = (Functions *)name_of_recursive_routine;
  name_of_recursive_routine_local = vertex_shader_code;
  vertex_shader_code_local = (GLchar *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  __s = name_of_recursive_routine_local;
  local_29 = 1;
  pFStack_28 = (Functions *)CONCAT44(extraout_var,iVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"",(allocator<char> *)((long)&program.m_context + 7));
  program.m_context._0_4_ = 1;
  bVar1 = Utils::buildProgram((Functions *)CONCAT44(extraout_var,iVar2),&local_50,&local_88,
                              &local_b0,&local_d8,&local_100,&test::varying_name,
                              (uint *)&program.m_context,&this->m_vertex_shader_id,(GLuint *)0x0,
                              (GLuint *)0x0,(GLuint *)0x0,(GLuint *)0x0,&this->m_program_id);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&program.m_context + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  if (bVar1) {
    Utils::program::program((program *)local_130,(this->super_TestCase).m_context);
    exc._4_4_ = 0;
    Utils::program::build
              ((program *)local_130,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
               (GLchar *)0x0,name_of_recursive_routine_local,(GLchar **)0x0,0,false);
    exc._4_4_ = Utils::program::getSubroutineIndex((program *)local_130,(GLchar *)gl,0x8b31);
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(local_440,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (local_440,
                        (char (*) [55])"Error. Program with potentially recursive subroutine, ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char **)&gl);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [27])", which is active, index: ");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(uint *)((long)&exc + 4));
    pMVar4 = tcu::MessageBuilder::operator<<
                       (pMVar4,(char (*) [32])", has been built successfully.\n");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&name_of_recursive_routine_local);
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(local_440);
    local_29 = 0;
    Utils::program::~program((program *)local_130);
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])();
  return (bool)(local_29 & 1);
}

Assistant:

bool NegativeTest7::test(const GLchar* vertex_shader_code, const GLchar* name_of_recursive_routine)
{
	const glw::Functions& gl		   = m_context.getRenderContext().getFunctions();
	bool				  result	   = true;
	static const GLchar*  varying_name = "out_result";

	/* Try to build program */
	if (true == Utils::buildProgram(gl, vertex_shader_code, "", "", "", "", &varying_name /* varying_names */,
									1 /* n_varyings */, &m_vertex_shader_id, 0, 0, 0, 0, &m_program_id))
	{
		/* Success is considered an error */

		Utils::program program(m_context);
		GLuint		   index = 0;

		program.build(0, 0, 0, 0, 0, vertex_shader_code, 0, 0);

		/* Verify that recursive subroutine is active */
		try
		{
			index = program.getSubroutineIndex(name_of_recursive_routine, GL_VERTEX_SHADER);
		}
		catch (const std::exception& exc)
		{
			/* Something wrong with shader or compilation */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "It is expected that subroutine: \n"
				<< name_of_recursive_routine
				<< " is considered active. This subroutine is potentially recursive and should cause link failure."
				<< tcu::TestLog::EndMessage;

			throw exc;
		}

		/* Subsoutine is active, however linking should fail */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Program with potentially recursive subroutine, "
			<< name_of_recursive_routine << ", which is active, index: " << index << ", has been built successfully.\n"
			<< vertex_shader_code << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Delete program and shader */
	deinit();

	/* Done */
	return result;
}